

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::StartTesting(BasicReporter *this)

{
  SpanInfo local_30;
  
  local_30.name._M_dataplus._M_p = (pointer)&local_30.name.field_2;
  local_30.name._M_string_length = 0;
  local_30.name.field_2._M_local_buf[0] = '\0';
  local_30.emitted = false;
  SpanInfo::operator=(&this->m_testingSpan,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

SourceLineInfo( std::string const& _file, std::size_t _line )
        :   file( _file ),
            line( _line )
        {}